

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__vertical_gather_with_2_coeffs_cont
               (float *outputp,float *vertical_coefficients,float **inputs,float *input0_end)

{
  float fVar1;
  float fVar2;
  float *in_RCX;
  undefined8 *in_RDX;
  float *in_RSI;
  float *in_RDI;
  __m128 o2;
  __m128 o1;
  __m128 o0;
  __m128 c1;
  __m128 c0;
  float c1s;
  float *input1;
  float c0s;
  float *input0;
  float *output;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  float *local_420;
  float *local_410;
  float *local_408;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_78;
  float o0_2;
  __m128 r0_1;
  __m128 o0_1;
  __m128 r3;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 o3;
  
  fVar1 = *in_RSI;
  local_420 = (float *)in_RDX[1];
  fVar2 = in_RSI[1];
  local_408 = in_RDI;
  for (local_410 = (float *)*in_RDX; 0x3f < (long)in_RCX - (long)local_410;
      local_410 = local_410 + 0x10) {
    local_198 = (float)*(undefined8 *)local_410;
    fStack_194 = (float)((ulong)*(undefined8 *)local_410 >> 0x20);
    fStack_190 = (float)*(undefined8 *)(local_410 + 2);
    fStack_18c = (float)((ulong)*(undefined8 *)(local_410 + 2) >> 0x20);
    o0_1[2] = (float)*(undefined8 *)local_408;
    o0_1[3] = (float)((ulong)*(undefined8 *)local_408 >> 0x20);
    r3[0] = (float)*(undefined8 *)(local_408 + 2);
    r3[1] = (float)((ulong)*(undefined8 *)(local_408 + 2) >> 0x20);
    local_1b8 = (float)*(undefined8 *)(local_410 + 4);
    fStack_1b4 = (float)((ulong)*(undefined8 *)(local_410 + 4) >> 0x20);
    fStack_1b0 = (float)*(undefined8 *)(local_410 + 6);
    fStack_1ac = (float)((ulong)*(undefined8 *)(local_410 + 6) >> 0x20);
    fStack_78 = (float)*(undefined8 *)(local_408 + 4);
    o0_2 = (float)((ulong)*(undefined8 *)(local_408 + 4) >> 0x20);
    r0_1[0] = (float)*(undefined8 *)(local_408 + 6);
    r0_1[1] = (float)((ulong)*(undefined8 *)(local_408 + 6) >> 0x20);
    local_1d8 = (float)*(undefined8 *)(local_410 + 8);
    fStack_1d4 = (float)((ulong)*(undefined8 *)(local_410 + 8) >> 0x20);
    fStack_1d0 = (float)*(undefined8 *)(local_410 + 10);
    fStack_1cc = (float)((ulong)*(undefined8 *)(local_410 + 10) >> 0x20);
    local_98 = (float)*(undefined8 *)(local_408 + 8);
    fStack_94 = (float)((ulong)*(undefined8 *)(local_408 + 8) >> 0x20);
    fStack_90 = (float)*(undefined8 *)(local_408 + 10);
    fStack_8c = (float)((ulong)*(undefined8 *)(local_408 + 10) >> 0x20);
    local_1f8 = (float)*(undefined8 *)(local_410 + 0xc);
    fStack_1f4 = (float)((ulong)*(undefined8 *)(local_410 + 0xc) >> 0x20);
    fStack_1f0 = (float)*(undefined8 *)(local_410 + 0xe);
    fStack_1ec = (float)((ulong)*(undefined8 *)(local_410 + 0xe) >> 0x20);
    local_b8 = (float)*(undefined8 *)(local_408 + 0xc);
    fStack_b4 = (float)((ulong)*(undefined8 *)(local_408 + 0xc) >> 0x20);
    fStack_b0 = (float)*(undefined8 *)(local_408 + 0xe);
    fStack_ac = (float)((ulong)*(undefined8 *)(local_408 + 0xe) >> 0x20);
    local_218 = (float)*(undefined8 *)local_420;
    fStack_214 = (float)((ulong)*(undefined8 *)local_420 >> 0x20);
    fStack_210 = (float)*(undefined8 *)(local_420 + 2);
    fStack_20c = (float)((ulong)*(undefined8 *)(local_420 + 2) >> 0x20);
    local_458 = CONCAT44(o0_1[3] + fStack_194 * fVar1 + fStack_214 * fVar2,
                         o0_1[2] + local_198 * fVar1 + local_218 * fVar2);
    uStack_450 = CONCAT44(r3[1] + fStack_18c * fVar1 + fStack_20c * fVar2,
                          r3[0] + fStack_190 * fVar1 + fStack_210 * fVar2);
    local_238 = (float)*(undefined8 *)(local_420 + 4);
    fStack_234 = (float)((ulong)*(undefined8 *)(local_420 + 4) >> 0x20);
    fStack_230 = (float)*(undefined8 *)(local_420 + 6);
    fStack_22c = (float)((ulong)*(undefined8 *)(local_420 + 6) >> 0x20);
    local_468 = CONCAT44(o0_2 + fStack_1b4 * fVar1 + fStack_234 * fVar2,
                         fStack_78 + local_1b8 * fVar1 + local_238 * fVar2);
    uStack_460 = CONCAT44(r0_1[1] + fStack_1ac * fVar1 + fStack_22c * fVar2,
                          r0_1[0] + fStack_1b0 * fVar1 + fStack_230 * fVar2);
    local_258 = (float)*(undefined8 *)(local_420 + 8);
    fStack_254 = (float)((ulong)*(undefined8 *)(local_420 + 8) >> 0x20);
    fStack_250 = (float)*(undefined8 *)(local_420 + 10);
    fStack_24c = (float)((ulong)*(undefined8 *)(local_420 + 10) >> 0x20);
    local_478 = CONCAT44(fStack_94 + fStack_1d4 * fVar1 + fStack_254 * fVar2,
                         local_98 + local_1d8 * fVar1 + local_258 * fVar2);
    uStack_470 = CONCAT44(fStack_8c + fStack_1cc * fVar1 + fStack_24c * fVar2,
                          fStack_90 + fStack_1d0 * fVar1 + fStack_250 * fVar2);
    local_278 = (float)*(undefined8 *)(local_420 + 0xc);
    fStack_274 = (float)((ulong)*(undefined8 *)(local_420 + 0xc) >> 0x20);
    fStack_270 = (float)*(undefined8 *)(local_420 + 0xe);
    fStack_26c = (float)((ulong)*(undefined8 *)(local_420 + 0xe) >> 0x20);
    local_488 = CONCAT44(fStack_b4 + fStack_1f4 * fVar1 + fStack_274 * fVar2,
                         local_b8 + local_1f8 * fVar1 + local_278 * fVar2);
    uStack_480 = CONCAT44(fStack_ac + fStack_1ec * fVar1 + fStack_26c * fVar2,
                          fStack_b0 + fStack_1f0 * fVar1 + fStack_270 * fVar2);
    *(undefined8 *)local_408 = local_458;
    *(undefined8 *)(local_408 + 2) = uStack_450;
    *(undefined8 *)(local_408 + 4) = local_468;
    *(undefined8 *)(local_408 + 6) = uStack_460;
    *(undefined8 *)(local_408 + 8) = local_478;
    *(undefined8 *)(local_408 + 10) = uStack_470;
    *(undefined8 *)(local_408 + 0xc) = local_488;
    *(undefined8 *)(local_408 + 0xe) = uStack_480;
    local_408 = local_408 + 0x10;
    local_420 = local_420 + 0x10;
  }
  for (; 0xf < (long)in_RCX - (long)local_410; local_410 = local_410 + 4) {
    local_298 = (float)*(undefined8 *)local_410;
    fStack_294 = (float)((ulong)*(undefined8 *)local_410 >> 0x20);
    fStack_290 = (float)*(undefined8 *)(local_410 + 2);
    fStack_28c = (float)((ulong)*(undefined8 *)(local_410 + 2) >> 0x20);
    local_158 = (float)*(undefined8 *)local_408;
    fStack_154 = (float)((ulong)*(undefined8 *)local_408 >> 0x20);
    fStack_150 = (float)*(undefined8 *)(local_408 + 2);
    fStack_14c = (float)((ulong)*(undefined8 *)(local_408 + 2) >> 0x20);
    local_2b8 = (float)*(undefined8 *)local_420;
    fStack_2b4 = (float)((ulong)*(undefined8 *)local_420 >> 0x20);
    fStack_2b0 = (float)*(undefined8 *)(local_420 + 2);
    fStack_2ac = (float)((ulong)*(undefined8 *)(local_420 + 2) >> 0x20);
    local_4d8 = CONCAT44(fStack_154 + fStack_294 * fVar1 + fStack_2b4 * fVar2,
                         local_158 + local_298 * fVar1 + local_2b8 * fVar2);
    uStack_4d0 = CONCAT44(fStack_14c + fStack_28c * fVar1 + fStack_2ac * fVar2,
                          fStack_150 + fStack_290 * fVar1 + fStack_2b0 * fVar2);
    *(undefined8 *)local_408 = local_4d8;
    *(undefined8 *)(local_408 + 2) = uStack_4d0;
    local_408 = local_408 + 4;
    local_420 = local_420 + 4;
  }
  for (; local_410 < in_RCX; local_410 = local_410 + 1) {
    *local_408 = *local_420 * fVar2 + *local_408 + *local_410 * fVar1;
    local_408 = local_408 + 1;
    local_420 = local_420 + 1;
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_gather_with_,_coeffs)( float * outputp, float const * vertical_coefficients, float const ** inputs, float const * input0_end )
{
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = outputp;

  stbIF0( float const * input0 = inputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float const * input1 = inputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float const * input2 = inputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float const * input3 = inputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float const * input4 = inputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float const * input5 = inputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float const * input6 = inputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float const * input7 = inputs[7]; float c7s = vertical_coefficients[7]; )

#if ( STBIR__vertical_channels == 1 ) && !defined(STB_IMAGE_RESIZE_VERTICAL_CONTINUE)
  // check single channel one weight
  if ( ( c0s >= (1.0f-0.000001f) ) && ( c0s <= (1.0f+0.000001f) ) )
  {
    STBIR_MEMCPY( output, input0, (char*)input0_end - (char*)input0 );
    return;
  }
#endif

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output);

      // prefetch four loop iterations ahead (doesn't affect much for small resizes, but helps with big ones)
      stbIF0( stbir__prefetch( input0 + (16*stbir__simdfX_float_count) ); )
      stbIF1( stbir__prefetch( input1 + (16*stbir__simdfX_float_count) ); )
      stbIF2( stbir__prefetch( input2 + (16*stbir__simdfX_float_count) ); )
      stbIF3( stbir__prefetch( input3 + (16*stbir__simdfX_float_count) ); )
      stbIF4( stbir__prefetch( input4 + (16*stbir__simdfX_float_count) ); )
      stbIF5( stbir__prefetch( input5 + (16*stbir__simdfX_float_count) ); )
      stbIF6( stbir__prefetch( input6 + (16*stbir__simdfX_float_count) ); )
      stbIF7( stbir__prefetch( input7 + (16*stbir__simdfX_float_count) ); )

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output );      stbir__simdfX_load( o1, output+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( o3, output+(3*stbir__simdfX_float_count) );
              stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );                         stbir__simdfX_madd( o2, o2, r2, c0 );                             stbir__simdfX_madd( o3, o3, r3, c0 ); )
      #else
      stbIF0( stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );                             stbir__simdfX_mult( o2, r2, c0 );                                 stbir__simdfX_mult( o3, r3, c0 );  )
      #endif

      stbIF1( stbir__simdfX_load( r0, input1 );      stbir__simdfX_load( r1, input1+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input1+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );                         stbir__simdfX_madd( o2, o2, r2, c1 );                             stbir__simdfX_madd( o3, o3, r3, c1 ); )
      stbIF2( stbir__simdfX_load( r0, input2 );      stbir__simdfX_load( r1, input2+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input2+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );                         stbir__simdfX_madd( o2, o2, r2, c2 );                             stbir__simdfX_madd( o3, o3, r3, c2 ); )
      stbIF3( stbir__simdfX_load( r0, input3 );      stbir__simdfX_load( r1, input3+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input3+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );                         stbir__simdfX_madd( o2, o2, r2, c3 );                             stbir__simdfX_madd( o3, o3, r3, c3 ); )
      stbIF4( stbir__simdfX_load( r0, input4 );      stbir__simdfX_load( r1, input4+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input4+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );                         stbir__simdfX_madd( o2, o2, r2, c4 );                             stbir__simdfX_madd( o3, o3, r3, c4 ); )
      stbIF5( stbir__simdfX_load( r0, input5 );      stbir__simdfX_load( r1, input5+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input5+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );                         stbir__simdfX_madd( o2, o2, r2, c5 );                             stbir__simdfX_madd( o3, o3, r3, c5 ); )
      stbIF6( stbir__simdfX_load( r0, input6 );      stbir__simdfX_load( r1, input6+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input6+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );                         stbir__simdfX_madd( o2, o2, r2, c6 );                             stbir__simdfX_madd( o3, o3, r3, c6 ); )
      stbIF7( stbir__simdfX_load( r0, input7 );      stbir__simdfX_load( r1, input7+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input7+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );                         stbir__simdfX_madd( o2, o2, r2, c7 );                             stbir__simdfX_madd( o3, o3, r3, c7 ); )

      stbir__simdfX_store( output, o0 );             stbir__simdfX_store( output+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output+(2*stbir__simdfX_float_count), o2 );  stbir__simdfX_store( output+(3*stbir__simdfX_float_count), o3 );
      output += (4*stbir__simdfX_float_count);
      stbIF0( input0 += (4*stbir__simdfX_float_count); ) stbIF1( input1 += (4*stbir__simdfX_float_count); ) stbIF2( input2 += (4*stbir__simdfX_float_count); ) stbIF3( input3 += (4*stbir__simdfX_float_count); ) stbIF4( input4 += (4*stbir__simdfX_float_count); ) stbIF5( input5 += (4*stbir__simdfX_float_count); ) stbIF6( input6 += (4*stbir__simdfX_float_count); ) stbIF7( input7 += (4*stbir__simdfX_float_count); )
    }

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output);

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output );   stbir__simdf_load( r0, input0 ); stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #else
      stbIF0( stbir__simdf_load( r0, input0 );  stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #endif
      stbIF1( stbir__simdf_load( r0, input1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) ); )
      stbIF2( stbir__simdf_load( r0, input2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) ); )
      stbIF3( stbir__simdf_load( r0, input3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) ); )
      stbIF4( stbir__simdf_load( r0, input4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) ); )
      stbIF5( stbir__simdf_load( r0, input5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) ); )
      stbIF6( stbir__simdf_load( r0, input6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) ); )
      stbIF7( stbir__simdf_load( r0, input7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) ); )

      stbir__simdf_store( output, o0 );
      output += 4;
      stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
  {
    float o0, o1, o2, o3;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; o1 = output[1] + input0[1] * c0s; o2 = output[2] + input0[2] * c0s; o3 = output[3] + input0[3] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; o1  = input0[1] * c0s; o2  = input0[2] * c0s; o3  = input0[3] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; o1 += input1[1] * c1s; o2 += input1[2] * c1s; o3 += input1[3] * c1s; )
    stbIF2( o0 += input2[0] * c2s; o1 += input2[1] * c2s; o2 += input2[2] * c2s; o3 += input2[3] * c2s; )
    stbIF3( o0 += input3[0] * c3s; o1 += input3[1] * c3s; o2 += input3[2] * c3s; o3 += input3[3] * c3s; )
    stbIF4( o0 += input4[0] * c4s; o1 += input4[1] * c4s; o2 += input4[2] * c4s; o3 += input4[3] * c4s; )
    stbIF5( o0 += input5[0] * c5s; o1 += input5[1] * c5s; o2 += input5[2] * c5s; o3 += input5[3] * c5s; )
    stbIF6( o0 += input6[0] * c6s; o1 += input6[1] * c6s; o2 += input6[2] * c6s; o3 += input6[3] * c6s; )
    stbIF7( o0 += input7[0] * c7s; o1 += input7[1] * c7s; o2 += input7[2] * c7s; o3 += input7[3] * c7s; )
    output[0] = o0; output[1] = o1; output[2] = o2; output[3] = o3;
    output += 4;
    stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input0 < input0_end )
  {
    float o0;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; )
    stbIF2( o0 += input2[0] * c2s; )
    stbIF3( o0 += input3[0] * c3s; )
    stbIF4( o0 += input4[0] * c4s; )
    stbIF5( o0 += input5[0] * c5s; )
    stbIF6( o0 += input6[0] * c6s; )
    stbIF7( o0 += input7[0] * c7s; )
    output[0] = o0;
    ++output;
    stbIF0( ++input0; ) stbIF1( ++input1; ) stbIF2( ++input2; ) stbIF3( ++input3; ) stbIF4( ++input4; ) stbIF5( ++input5; ) stbIF6( ++input6; ) stbIF7( ++input7; )
  }
}